

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.cpp
# Opt level: O1

GdlRuleItem * __thiscall
GdlRule::RhsItemAt(GdlRule *this,GrpLineAndFile *lnf,int irit,string *staInput,string *staAlias,
                  bool fSubItem)

{
  pointer *pppGVar1;
  pointer *pppGVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  long lVar5;
  iterator iVar6;
  iterator __position;
  GrcSymbolTable *pGVar7;
  string *psVar8;
  bool bVar9;
  int iVar10;
  Symbol pGVar11;
  GdlSetAttrItem *pGVar12;
  vector<GdlRuleItem*,std::allocator<GdlRuleItem*>> *pvVar13;
  GdlSetAttrItem *pGVar14;
  Symbol pGVar15;
  GdlAlias *pGVar16;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar17;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  undefined7 in_register_00000089;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  GdlRuleItem *pritNew;
  GdlSetAttrItem *local_248;
  int local_23c;
  vector<GdlRuleItem*,std::allocator<GdlRuleItem*>> *local_238;
  GrpLineAndFile *local_230;
  Symbol local_228;
  undefined4 local_21c;
  GdlRule *local_218;
  string *local_210;
  GdlSetAttrItem *local_208;
  string *local_200;
  ulong local_1f8;
  int local_1ec;
  vector<GdlAlias*,std::allocator<GdlAlias*>> *local_1e8;
  string *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  string local_198;
  string local_178;
  long *local_158;
  long local_150;
  long local_148 [2];
  GdlAlias *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar7 = g_cman.m_psymtbl;
  local_21c = (undefined4)CONCAT71(in_register_00000089,fSubItem);
  pcVar3 = (staInput->_M_dataplus)._M_p;
  local_230 = lnf;
  local_210 = staAlias;
  local_200 = staInput;
  local_1ec = irit;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + staInput->_M_string_length);
  local_228 = GrcSymbolTable::FindSymbol(pGVar7,&local_50);
  uVar17 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    uVar17 = extraout_RDX_00;
  }
  local_238 = (vector<GdlRuleItem*,std::allocator<GdlRuleItem*>> *)&this->m_vprit;
  pGVar14 = (GdlSetAttrItem *)
            (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((GdlSetAttrItem *)
      (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
      super__Vector_impl_data._M_finish == pGVar14) {
    iVar10 = 2;
    local_1f8 = 0;
  }
  else {
    local_1e0 = &local_230->m_staFile;
    local_1e8 = (vector<GdlAlias*,std::allocator<GdlAlias*>> *)&this->m_vpalias;
    local_1f8 = 0;
    uVar19 = 0;
    iVar18 = 0;
    local_218 = this;
    do {
      pp_Var4 = (&(pGVar14->super_GdlRuleItem)._vptr_GdlRuleItem)[uVar19];
      if (pp_Var4 == (_func_int **)0x0) {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar17;
        auVar20 = auVar20 << 0x40;
      }
      else {
        auVar20 = __dynamic_cast(pp_Var4,&GdlRuleItem::typeinfo,&GdlSetAttrItem::typeinfo);
      }
      pGVar11 = local_228;
      uVar17 = auVar20._8_8_;
      pGVar14 = auVar20._0_8_;
      iVar10 = 0;
      if (pGVar14 == (GdlSetAttrItem *)0x0) {
        bVar9 = true;
        uVar17 = CONCAT71(auVar20._9_7_,1);
        local_1f8 = uVar17;
      }
      else if (iVar18 == local_1ec) {
        local_23c = iVar18;
        if ((local_228 == (GrcSymbolTableEntry *)0x0) ||
           ((((bVar9 = GrcSymbolTableEntry::FitsSymbolType(local_228,ksymtClass), !bVar9 &&
              (bVar9 = GrcSymbolTableEntry::FitsSymbolType(pGVar11,ksymtSpecialUnderscore), !bVar9))
             && (bVar9 = GrcSymbolTableEntry::FitsSymbolType(pGVar11,ksymtSpecialLb), !bVar9)) &&
            (bVar9 = GrcSymbolTableEntry::FitsSymbolType(pGVar11,ksymtSpecialAt), !bVar9)))) {
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"Undefined class name: ","");
          pcVar3 = (local_200->_M_dataplus)._M_p;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar3,pcVar3 + local_200->_M_string_length);
          GrcErrorList::AddItem
                    (&g_errorList,true,0xc41,&local_218->super_GdlObject,local_230,&local_178,
                     &local_f0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0
                     ,(string *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          local_198.field_2._8_5_ = 0x2a64656e69;
          local_198.field_2._M_allocated_capacity._0_5_ = 0x6e5543472a;
          local_198.field_2._M_allocated_capacity._5_3_ = 0x666564;
          local_198._M_string_length = 0xd;
          local_198.field_2._M_local_buf[0xd] = '\0';
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          pGVar11 = GrcSymbolTable::FindSymbol(g_cman.m_psymtbl,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT35(local_198.field_2._M_allocated_capacity._5_3_,
                                     local_198.field_2._M_allocated_capacity._0_5_) + 1);
          }
        }
        local_228 = pGVar11;
        bVar9 = GrcSymbolTableEntry::FitsSymbolType(pGVar11,ksymtSpecialLb);
        pvVar13 = local_238;
        iVar18 = local_23c;
        if (bVar9) {
          iVar10 = 5;
          bVar9 = false;
          uVar17 = extraout_RDX_01;
          this = local_218;
        }
        else {
          if ((char)local_21c == '\0') {
            lVar5 = *(long *)(*(long *)local_238 + uVar19 * 8);
            *(undefined8 *)(lVar5 + 8) = *(undefined8 *)local_230;
            std::__cxx11::string::_M_assign((string *)(lVar5 + 0x10));
            psVar8 = local_210;
            *(Symbol *)(*(long *)(*(long *)pvVar13 + uVar19 * 8) + 0x38) = local_228;
            iVar10 = std::__cxx11::string::compare((char *)local_210);
            this = local_218;
            uVar17 = extraout_RDX_02;
            if (iVar10 != 0) {
              pGVar14 = (GdlSetAttrItem *)operator_new(0x28);
              local_1d8 = local_1c8;
              pcVar3 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,pcVar3,pcVar3 + psVar8->_M_string_length);
              iVar10 = *(int *)(*(long *)(*(long *)local_238 + uVar19 * 8) + 0x30);
              ((_Alloc_hider *)&(pGVar14->super_GdlRuleItem)._vptr_GdlRuleItem)->_M_p =
                   (pointer)&(pGVar14->super_GdlRuleItem).super_GdlObject.m_lnf.m_staFile;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pGVar14,local_1d8,local_1d0 + (long)local_1d8);
              *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(pGVar14->super_GdlRuleItem).super_GdlObject.m_lnf.m_staFile)->
                       _M_local_buf + 0x10) = iVar10 + 1;
              iVar6._M_current =
                   (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              local_248 = pGVar14;
              if (iVar6._M_current ==
                  (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<GdlAlias*,std::allocator<GdlAlias*>>::_M_realloc_insert<GdlAlias*>
                          (local_1e8,iVar6,(GdlAlias **)&local_248);
                uVar17 = extraout_RDX_04;
              }
              else {
                *iVar6._M_current = (GdlAlias *)pGVar14;
                pppGVar1 = &(this->m_vpalias).
                            super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppGVar1 = *pppGVar1 + 1;
                uVar17 = extraout_RDX_03;
              }
              pvVar13 = local_238;
              iVar18 = local_23c;
              if (local_1d8 != local_1c8) {
                operator_delete(local_1d8,local_1c8[0] + 1);
                pvVar13 = local_238;
                uVar17 = extraout_RDX_05;
                iVar18 = local_23c;
              }
            }
            local_208 = *(GdlSetAttrItem **)(*(long *)pvVar13 + uVar19 * 8);
          }
          else {
            pGVar12 = (GdlSetAttrItem *)operator_new(0xf0);
            GdlSetAttrItem::GdlSetAttrItem(pGVar12,pGVar14);
            (pGVar12->super_GdlRuleItem)._vptr_GdlRuleItem = (_func_int **)&PTR_Clone_00242ab0;
            pGVar12[1].super_GdlRuleItem._vptr_GdlRuleItem =
                 (_func_int **)(pGVar14->super_GdlRuleItem).m_psymInput;
            *(undefined8 *)&pGVar12[1].super_GdlRuleItem.m_iritContextPos = 0;
            pGVar12[1].super_GdlRuleItem.m_psymInput = (Symbol)0x0;
            pGVar12[1].super_GdlRuleItem.m_pexpConstraint = (GdlExpression *)0x0;
            pGVar12[1].super_GdlRuleItem.super_GdlObject.m_lnf.m_nLinePre = 0;
            pGVar12[1].super_GdlRuleItem.super_GdlObject.m_lnf.m_nLineOrig = 0;
            pGVar12[1].super_GdlRuleItem.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p =
                 (pointer)0x0;
            pGVar12[1].super_GdlRuleItem.super_GdlObject.m_lnf.m_staFile._M_string_length = 0;
            pGVar12[1].super_GdlRuleItem.super_GdlObject.m_lnf.m_staFile.field_2.
            _M_allocated_capacity = 0;
            *(undefined4 *)&pGVar12[1].super_GdlRuleItem.m_staAlias._M_dataplus._M_p = 0xffffffff;
            iVar10 = local_230->m_nLineOrig;
            (pGVar12->super_GdlRuleItem).super_GdlObject.m_lnf.m_nLinePre = local_230->m_nLinePre;
            (pGVar12->super_GdlRuleItem).super_GdlObject.m_lnf.m_nLineOrig = iVar10;
            std::__cxx11::string::_M_assign
                      ((string *)&(pGVar12->super_GdlRuleItem).super_GdlObject.m_lnf.m_staFile);
            psVar8 = local_210;
            pGVar12[1].super_GdlRuleItem._vptr_GdlRuleItem = (_func_int **)local_228;
            (pGVar12->super_GdlRuleItem).m_psymInput = (Symbol)0x0;
            local_208 = pGVar12;
            iVar10 = std::__cxx11::string::compare((char *)local_210);
            this = local_218;
            if (iVar10 != 0) {
              pGVar12 = (GdlSetAttrItem *)operator_new(0x28);
              local_1b8 = local_1a8;
              pcVar3 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,pcVar3,pcVar3 + psVar8->_M_string_length);
              iVar10 = *(int *)(*(long *)(*(long *)local_238 + uVar19 * 8) + 0x30);
              ((_Alloc_hider *)&(pGVar12->super_GdlRuleItem)._vptr_GdlRuleItem)->_M_p =
                   (pointer)&(pGVar12->super_GdlRuleItem).super_GdlObject.m_lnf.m_staFile;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pGVar12,local_1b8,local_1b0 + (long)local_1b8);
              *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(pGVar12->super_GdlRuleItem).super_GdlObject.m_lnf.m_staFile)->
                       _M_local_buf + 0x10) = iVar10 + 1;
              iVar6._M_current =
                   (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              local_248 = pGVar12;
              if (iVar6._M_current ==
                  (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<GdlAlias*,std::allocator<GdlAlias*>>::_M_realloc_insert<GdlAlias*>
                          (local_1e8,iVar6,(GdlAlias **)&local_248);
              }
              else {
                *iVar6._M_current = (GdlAlias *)pGVar12;
                pppGVar1 = &(this->m_vpalias).
                            super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppGVar1 = *pppGVar1 + 1;
              }
              iVar18 = local_23c;
              if (local_1b8 != local_1a8) {
                operator_delete(local_1b8,local_1a8[0] + 1);
              }
            }
            (*(pGVar14->super_GdlRuleItem)._vptr_GdlRuleItem[2])(pGVar14);
            *(GdlSetAttrItem **)(*(long *)local_238 + uVar19 * 8) = local_208;
            uVar17 = extraout_RDX_06;
          }
          iVar10 = 1;
          bVar9 = false;
        }
      }
      else {
        iVar18 = iVar18 + 1;
        bVar9 = true;
      }
      pGVar14 = local_208;
      if (!bVar9) goto LAB_0015dbdd;
      uVar19 = uVar19 + 1;
      pGVar14 = (GdlSetAttrItem *)
                (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(this->m_vprit).
                                    super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar14 >> 3)
            );
    iVar10 = 2;
    pGVar14 = local_208;
  }
LAB_0015dbdd:
  if ((iVar10 == 5) || (iVar10 == 2)) {
    iVar10 = std::__cxx11::string::compare((char *)local_200);
    pGVar11 = local_228;
    if (iVar10 == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Line break indicator # cannot appear in the right-hand-side",
                 "");
      GrcErrorList::AddError(&g_errorList,0xc42,&this->super_GdlObject,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pGVar14 = (GdlSetAttrItem *)0x0;
    }
    else {
      if ((local_228 == (GrcSymbolTableEntry *)0x0) ||
         (((bVar9 = GrcSymbolTableEntry::FitsSymbolType(local_228,ksymtClass), !bVar9 &&
           (bVar9 = GrcSymbolTableEntry::FitsSymbolType(pGVar11,ksymtSpecialUnderscore), !bVar9)) &&
          (bVar9 = GrcSymbolTableEntry::FitsSymbolType(pGVar11,ksymtSpecialAt), !bVar9)))) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Undefined class name: ","");
        pcVar3 = (local_200->_M_dataplus)._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + local_200->_M_string_length);
        GrcErrorList::AddItem
                  (&g_errorList,true,0xc43,&this->super_GdlObject,local_230,&local_110,&local_90,
                   (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        local_b0.field_2._M_allocated_capacity._0_5_ = 0x6e5543472a;
        local_b0.field_2._M_allocated_capacity._5_3_ = 0x666564;
        local_b0.field_2._8_5_ = 0x2a64656e69;
        local_b0._M_string_length = 0xd;
        local_b0.field_2._M_local_buf[0xd] = '\0';
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pGVar11 = GrcSymbolTable::FindSymbol(g_cman.m_psymtbl,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT35(local_b0.field_2._M_allocated_capacity._5_3_,
                                   local_b0.field_2._M_allocated_capacity._0_5_) + 1);
        }
      }
      pvVar13 = local_238;
      if ((local_1f8 & 1) != 0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "Context does not account for all items in the right-hand-side","");
        GrcErrorList::AddError(&g_errorList,0xc44,&this->super_GdlObject,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((char)local_21c == '\0') {
        pGVar14 = (GdlSetAttrItem *)operator_new(0x98);
        GdlObject::GdlObject(&(pGVar14->super_GdlRuleItem).super_GdlObject);
        (pGVar14->super_GdlRuleItem).m_iritContextPos = -1;
        (pGVar14->super_GdlRuleItem).m_psymInput = pGVar11;
        (pGVar14->super_GdlRuleItem).m_pexpConstraint = (GdlExpression *)0x0;
        (pGVar14->super_GdlRuleItem).m_staAlias._M_dataplus._M_p =
             (pointer)&(pGVar14->super_GdlRuleItem).m_staAlias.field_2;
        (pGVar14->super_GdlRuleItem).m_staAlias._M_string_length = 0;
        (pGVar14->super_GdlRuleItem).m_staAlias.field_2._M_local_buf[0] = '\0';
        (pGVar14->super_GdlRuleItem).m_iritContextPosOrig = -1;
        (pGVar14->super_GdlRuleItem)._vptr_GdlRuleItem = (_func_int **)&PTR_Clone_002434f8;
        (pGVar14->m_vpavs).
        super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pGVar14->m_vpavs).
        super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pGVar14->m_vpavs).
        super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pGVar14->m_nAttachTo = -1;
        local_248 = pGVar14;
      }
      else {
        pGVar14 = (GdlSetAttrItem *)operator_new(0xf0);
        pGVar7 = g_cman.m_psymtbl;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"_","");
        pGVar15 = GrcSymbolTable::FindSymbol(pGVar7,&local_130);
        GdlObject::GdlObject(&(pGVar14->super_GdlRuleItem).super_GdlObject);
        (pGVar14->super_GdlRuleItem).m_iritContextPos = -1;
        (pGVar14->super_GdlRuleItem).m_psymInput = pGVar15;
        (pGVar14->super_GdlRuleItem).m_pexpConstraint = (GdlExpression *)0x0;
        (pGVar14->super_GdlRuleItem).m_staAlias._M_dataplus._M_p =
             (pointer)&(pGVar14->super_GdlRuleItem).m_staAlias.field_2;
        (pGVar14->super_GdlRuleItem).m_staAlias._M_string_length = 0;
        (pGVar14->super_GdlRuleItem).m_staAlias.field_2._M_local_buf[0] = '\0';
        (pGVar14->super_GdlRuleItem).m_iritContextPosOrig = -1;
        (pGVar14->m_vpavs).
        super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pGVar14->m_vpavs).
        super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pGVar14->m_vpavs).
        super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pGVar14->m_nAttachTo = -1;
        (pGVar14->super_GdlRuleItem)._vptr_GdlRuleItem = (_func_int **)&PTR_Clone_00242ab0;
        *(Symbol *)&pGVar14[1].super_GdlRuleItem = pGVar11;
        *(char *)&pGVar14[1].super_GdlRuleItem.m_iritContextPos = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_iritContextPos + 1) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_iritContextPos + 2) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_iritContextPos + 3) = '\0';
        pGVar14[1].super_GdlRuleItem.field_0x34 = '\0';
        pGVar14[1].super_GdlRuleItem.field_0x35 = '\0';
        pGVar14[1].super_GdlRuleItem.field_0x36 = '\0';
        pGVar14[1].super_GdlRuleItem.field_0x37 = '\0';
        *(char *)&pGVar14[1].super_GdlRuleItem.m_psymInput = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 1) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 2) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 3) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 4) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 5) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 6) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_psymInput + 7) = '\0';
        *(char *)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 1) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 2) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 3) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 4) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 5) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 6) = '\0';
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_pexpConstraint + 7) = '\0';
        *(undefined8 *)((long)&pGVar14[1].super_GdlRuleItem + 8) = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pGVar14[1].super_GdlRuleItem)[1]._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pGVar14[1].super_GdlRuleItem + 0x18) = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pGVar14[1].super_GdlRuleItem)[2]._M_allocated_capacity = 0;
        *(char *)&pGVar14[1].super_GdlRuleItem.m_staAlias._M_dataplus._M_p = -1;
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_staAlias._M_dataplus._M_p + 1) = -1;
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_staAlias._M_dataplus._M_p + 2) = -1;
        *(char *)((long)&pGVar14[1].super_GdlRuleItem.m_staAlias._M_dataplus._M_p + 3) = -1;
        local_248 = pGVar14;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
      }
      iVar10 = local_230->m_nLineOrig;
      (local_248->super_GdlRuleItem).super_GdlObject.m_lnf.m_nLinePre = local_230->m_nLinePre;
      (local_248->super_GdlRuleItem).super_GdlObject.m_lnf.m_nLineOrig = iVar10;
      std::__cxx11::string::_M_assign
                ((string *)&(local_248->super_GdlRuleItem).super_GdlObject.m_lnf.m_staFile);
      psVar8 = local_210;
      iVar10 = (int)((ulong)((long)(this->m_vprit).
                                   super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_vprit).
                                  super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      (local_248->super_GdlRuleItem).m_iritContextPos = iVar10;
      (local_248->super_GdlRuleItem).m_iritContextPosOrig = iVar10;
      iVar10 = std::__cxx11::string::compare((char *)local_210);
      if (iVar10 != 0) {
        pGVar16 = (GdlAlias *)operator_new(0x28);
        pcVar3 = (psVar8->_M_dataplus)._M_p;
        local_158 = local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar3,pcVar3 + psVar8->_M_string_length);
        iVar10 = (local_248->super_GdlRuleItem).m_iritContextPos;
        (pGVar16->m_staName)._M_dataplus._M_p = (pointer)&(pGVar16->m_staName).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pGVar16,local_158,local_150 + (long)local_158);
        pGVar16->m_srIndex = iVar10 + 1;
        iVar6._M_current =
             (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_138 = pGVar16;
        if (iVar6._M_current ==
            (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GdlAlias*,std::allocator<GdlAlias*>>::_M_realloc_insert<GdlAlias*>
                    ((vector<GdlAlias*,std::allocator<GdlAlias*>> *)&this->m_vpalias,iVar6,
                     &local_138);
        }
        else {
          *iVar6._M_current = pGVar16;
          pppGVar1 = &(this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppGVar1 = *pppGVar1 + 1;
        }
        if (local_158 != local_148) {
          operator_delete(local_158,local_148[0] + 1);
        }
      }
      __position._M_current =
           (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<GdlRuleItem*,std::allocator<GdlRuleItem*>>::
        _M_realloc_insert<GdlRuleItem*const&>(pvVar13,__position,(GdlRuleItem **)&local_248);
        pGVar14 = local_248;
      }
      else {
        *__position._M_current = &local_248->super_GdlRuleItem;
        pppGVar2 = &(this->m_vprit).
                    super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppGVar2 = *pppGVar2 + 1;
        pGVar14 = local_248;
      }
    }
  }
  return &pGVar14->super_GdlRuleItem;
}

Assistant:

GdlRuleItem * GdlRule::RhsItemAt(GrpLineAndFile & lnf, int irit,
	std::string staInput, std::string staAlias, bool fSubItem)
{
	bool fContext = false;
	int critRhs = 0;

	Symbol psymClassOrPlaceHolder = g_cman.SymbolTable()->FindSymbol(staInput);

	for (size_t iritT = 0; iritT < m_vprit.size(); iritT++)
	{
		GdlSetAttrItem * pritset = dynamic_cast<GdlSetAttrItem*>(m_vprit[iritT]);
		if (!pritset)
			fContext = true;
		else
		{
			if (irit == critRhs)
			{
				if (!psymClassOrPlaceHolder || 
					(!psymClassOrPlaceHolder->FitsSymbolType(ksymtClass) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialUnderscore) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialLb) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialAt)))
				{
					g_errorList.AddError(3137, this,
						"Undefined class name: ",
						staInput,
						lnf);
					psymClassOrPlaceHolder =
						g_cman.SymbolTable()->FindSymbol(GdlGlyphClassDefn::Undefined());
				}

				if (psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialLb))
				{
					goto LLbError;
				}
				else if (fSubItem)
				{
					GdlSubstitutionItem * pritsub = new GdlSubstitutionItem(*pritset);
					pritsub->SetLineAndFile(lnf);
					pritsub->m_psymOutput = psymClassOrPlaceHolder;
					pritsub->m_psymInput = NULL;	// must be set by LHS

					//	record the 1-based slot-alias value, if any
					if (staAlias != "")
						m_vpalias.push_back(
							new GdlAlias(staAlias, m_vprit[iritT]->m_iritContextPos + 1));

					delete pritset;
					m_vprit[iritT] = pritsub;
					return pritsub;
				}

				else
				{
					m_vprit[iritT]->SetLineAndFile(lnf);
					m_vprit[iritT]->m_psymInput = psymClassOrPlaceHolder;

					//	record the 1-based slot-alias value, if any
					if (staAlias != "")
						m_vpalias.push_back(
							new GdlAlias(staAlias, m_vprit[iritT]->m_iritContextPos + 1));

					return m_vprit[iritT];
				}
			}

			else
				critRhs++;
		}
	}

	//	Need to add an item

LLbError:
	if (staInput == "#")
	{
		g_errorList.AddError(3138, this,
			"Line break indicator # cannot appear in the right-hand-side");
		return NULL;
	}

	if (!psymClassOrPlaceHolder ||
		(!psymClassOrPlaceHolder->FitsSymbolType(ksymtClass) &&
			!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialUnderscore) &&
			!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialAt)))
	{
		g_errorList.AddError(3139, this,
			"Undefined class name: ",
			staInput,
			lnf);
		psymClassOrPlaceHolder = g_cman.SymbolTable()->FindSymbol(GdlGlyphClassDefn::Undefined());
	}

	//	Record an error if there was a context for this rule--then pretend that
	//	there was an extra _ on the end of the context.
	if (fContext)
	{
		g_errorList.AddError(3140, this,
			"Context does not account for all items in the right-hand-side");
	}

	GdlRuleItem * pritNew;
	if (fSubItem)
		pritNew = new GdlSubstitutionItem(
			g_cman.SymbolTable()->FindSymbol("_"),
			psymClassOrPlaceHolder);
	else
		pritNew = new GdlSetAttrItem(psymClassOrPlaceHolder);

	pritNew->SetLineAndFile(lnf);
	pritNew->m_iritContextPos = int(m_vprit.size());
	pritNew->m_iritContextPosOrig = pritNew->m_iritContextPos;

	//	record the 1-based slot-alias value, if any
	if (staAlias != "")
		m_vpalias.push_back(new GdlAlias(staAlias, pritNew->m_iritContextPos + 1));

	m_vprit.push_back(pritNew);
	return pritNew;
}